

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctred.c
# Opt level: O0

void jpeg_idct_4x4(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  undefined1 uVar1;
  int iVar2;
  long lVar3;
  undefined1 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  JLONG z4;
  JLONG z3;
  JLONG z2;
  JLONG z1;
  JLONG tmp12;
  JLONG tmp10;
  JLONG tmp2;
  JLONG tmp0;
  int local_118 [16];
  int local_d8 [8];
  int local_b8 [9];
  int local_94;
  long local_90;
  int *local_80;
  JSAMPLE dcval_1;
  short *psStack_78;
  int dcval;
  short *local_70;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  uint local_24;
  long local_20;
  
  local_90 = *(long *)(in_RDI + 0x1a8) + 0x80;
  psStack_78 = *(short **)(in_RSI + 0x58);
  local_80 = local_118;
  local_70 = in_RDX;
  local_24 = in_R8D;
  local_20 = in_RCX;
  for (local_94 = 8; 0 < local_94; local_94 = local_94 + -1) {
    if (local_94 != 4) {
      if ((((local_70[8] == 0) && (local_70[0x10] == 0)) && (local_70[0x18] == 0)) &&
         (((local_70[0x28] == 0 && (local_70[0x30] == 0)) && (local_70[0x38] == 0)))) {
        iVar2 = (int)*local_70 * (int)*psStack_78 * 4;
        *local_80 = iVar2;
        local_80[8] = iVar2;
        local_80[0x10] = iVar2;
        local_80[0x18] = iVar2;
      }
      else {
        local_48 = (long)((int)*local_70 * (int)*psStack_78) * 0x4000;
        lVar3 = (long)((int)local_70[0x10] * (int)psStack_78[0x10]) * 0x3b21 +
                (long)((int)local_70[0x30] * (int)psStack_78[0x30]) * -0x187e;
        local_40 = local_48 + lVar3;
        local_48 = local_48 - lVar3;
        local_30 = (long)((int)local_70[0x38] * (int)psStack_78[0x38]) * -0x6c2 +
                   (long)((int)local_70[0x28] * (int)psStack_78[0x28]) * 0x2e75 +
                   (long)((int)local_70[0x18] * (int)psStack_78[0x18]) * -0x4587 +
                   (long)((int)local_70[8] * (int)psStack_78[8]) * 0x21f9;
        local_38 = (long)((int)local_70[0x38] * (int)psStack_78[0x38]) * -0x1050 +
                   (long)((int)local_70[0x28] * (int)psStack_78[0x28]) * -0x133e +
                   (long)((int)local_70[0x18] * (int)psStack_78[0x18]) * 0x1ccd +
                   (long)((int)local_70[8] * (int)psStack_78[8]) * 0x5203;
        *local_80 = (int)(local_40 + local_38 + 0x800 >> 0xc);
        local_80[0x18] = (int)((local_40 - local_38) + 0x800 >> 0xc);
        local_80[8] = (int)(local_48 + local_30 + 0x800 >> 0xc);
        local_80[0x10] = (int)((local_48 - local_30) + 0x800 >> 0xc);
      }
    }
    local_70 = local_70 + 1;
    psStack_78 = psStack_78 + 1;
    local_80 = local_80 + 1;
  }
  local_80 = local_118;
  for (local_94 = 0; local_94 < 4; local_94 = local_94 + 1) {
    puVar4 = (undefined1 *)(*(long *)(local_20 + (long)local_94 * 8) + (ulong)local_24);
    if (((local_80[1] == 0) && (local_80[2] == 0)) &&
       ((local_80[3] == 0 && (((local_80[5] == 0 && (local_80[6] == 0)) && (local_80[7] == 0)))))) {
      uVar1 = *(undefined1 *)(local_90 + (int)((uint)((long)*local_80 + 0x10 >> 5) & 0x3ff));
      *puVar4 = uVar1;
      puVar4[1] = uVar1;
      puVar4[2] = uVar1;
      puVar4[3] = uVar1;
    }
    else {
      lVar5 = (long)local_80[2] * 0x3b21 + (long)local_80[6] * -0x187e;
      lVar3 = (long)*local_80 * 0x4000 + lVar5;
      lVar5 = (long)*local_80 * 0x4000 - lVar5;
      lVar6 = (long)local_80[7] * -0x6c2 + (long)local_80[5] * 0x2e75 + (long)local_80[3] * -0x4587
              + (long)local_80[1] * 0x21f9;
      lVar7 = (long)local_80[7] * -0x1050 + (long)local_80[5] * -0x133e + (long)local_80[3] * 0x1ccd
              + (long)local_80[1] * 0x5203;
      *puVar4 = *(undefined1 *)(local_90 + (int)((uint)(lVar3 + lVar7 + 0x40000 >> 0x13) & 0x3ff));
      puVar4[3] = *(undefined1 *)
                   (local_90 + (int)((uint)((lVar3 - lVar7) + 0x40000 >> 0x13) & 0x3ff));
      puVar4[1] = *(undefined1 *)(local_90 + (int)((uint)(lVar5 + lVar6 + 0x40000 >> 0x13) & 0x3ff))
      ;
      puVar4[2] = *(undefined1 *)
                   (local_90 + (int)((uint)((lVar5 - lVar6) + 0x40000 >> 0x13) & 0x3ff));
    }
    local_80 = local_80 + 8;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_4x4(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp2, tmp10, tmp12;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE * 4];   /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; inptr++, quantptr++, wsptr++, ctr--) {
    /* Don't bother to process column 4, because second pass won't use it */
    if (ctr == DCTSIZE - 4)
      continue;
    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 2] == 0 &&
        inptr[DCTSIZE * 3] == 0 && inptr[DCTSIZE * 5] == 0 &&
        inptr[DCTSIZE * 6] == 0 && inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero; we need not examine term 4 for 4x4 output */
      int dcval = LEFT_SHIFT(DEQUANTIZE(inptr[DCTSIZE * 0],
                                        quantptr[DCTSIZE * 0]), PASS1_BITS);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;
      wsptr[DCTSIZE * 2] = dcval;
      wsptr[DCTSIZE * 3] = dcval;

      continue;
    }

    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS + 1);

    z2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp2 = MULTIPLY(z2, FIX_1_847759065) + MULTIPLY(z3, -FIX_0_765366865);

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);

    tmp0 = MULTIPLY(z1, -FIX_0_211164243) + /* sqrt(2) * ( c3-c1) */
           MULTIPLY(z2,  FIX_1_451774981) + /* sqrt(2) * ( c3+c7) */
           MULTIPLY(z3, -FIX_2_172734803) + /* sqrt(2) * (-c1-c5) */
           MULTIPLY(z4,  FIX_1_061594337);  /* sqrt(2) * ( c5+c7) */

    tmp2 = MULTIPLY(z1, -FIX_0_509795579) + /* sqrt(2) * (c7-c5) */
           MULTIPLY(z2, -FIX_0_601344887) + /* sqrt(2) * (c5-c1) */
           MULTIPLY(z3,  FIX_0_899976223) + /* sqrt(2) * (c3-c7) */
           MULTIPLY(z4,  FIX_2_562915447);  /* sqrt(2) * (c1+c3) */

    /* Final output stage */

    wsptr[DCTSIZE * 0] =
      (int)DESCALE(tmp10 + tmp2, CONST_BITS - PASS1_BITS + 1);
    wsptr[DCTSIZE * 3] =
      (int)DESCALE(tmp10 - tmp2, CONST_BITS - PASS1_BITS + 1);
    wsptr[DCTSIZE * 1] =
      (int)DESCALE(tmp12 + tmp0, CONST_BITS - PASS1_BITS + 1);
    wsptr[DCTSIZE * 2] =
      (int)DESCALE(tmp12 - tmp0, CONST_BITS - PASS1_BITS + 1);
  }

  /* Pass 2: process 4 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 4; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* It's not clear whether a zero row test is worthwhile here ... */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 &&
        wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[(int)DESCALE((JLONG)wsptr[0],
                                               PASS1_BITS + 3) & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;

      wsptr += DCTSIZE;         /* advance pointer to next row */
      continue;
    }
#endif

    /* Even part */

    tmp0 = LEFT_SHIFT((JLONG)wsptr[0], CONST_BITS + 1);

    tmp2 = MULTIPLY((JLONG)wsptr[2],  FIX_1_847759065) +
           MULTIPLY((JLONG)wsptr[6], -FIX_0_765366865);

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    /* Odd part */

    z1 = (JLONG)wsptr[7];
    z2 = (JLONG)wsptr[5];
    z3 = (JLONG)wsptr[3];
    z4 = (JLONG)wsptr[1];

    tmp0 = MULTIPLY(z1, -FIX_0_211164243) + /* sqrt(2) * ( c3-c1) */
           MULTIPLY(z2,  FIX_1_451774981) + /* sqrt(2) * ( c3+c7) */
           MULTIPLY(z3, -FIX_2_172734803) + /* sqrt(2) * (-c1-c5) */
           MULTIPLY(z4,  FIX_1_061594337);  /* sqrt(2) * ( c5+c7) */

    tmp2 = MULTIPLY(z1, -FIX_0_509795579) + /* sqrt(2) * (c7-c5) */
           MULTIPLY(z2, -FIX_0_601344887) + /* sqrt(2) * (c5-c1) */
           MULTIPLY(z3, FIX_0_899976223) +  /* sqrt(2) * (c3-c7) */
           MULTIPLY(z4, FIX_2_562915447);   /* sqrt(2) * (c1+c3) */

    /* Final output stage */

    outptr[0] = range_limit[(int)DESCALE(tmp10 + tmp2,
                                         CONST_BITS + PASS1_BITS + 3 + 1) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)DESCALE(tmp10 - tmp2,
                                         CONST_BITS + PASS1_BITS + 3 + 1) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)DESCALE(tmp12 + tmp0,
                                         CONST_BITS + PASS1_BITS + 3 + 1) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)DESCALE(tmp12 - tmp0,
                                         CONST_BITS + PASS1_BITS + 3 + 1) &
                            RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}